

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

DdNode * Abc_NtkBddCofactors_rec(DdManager *dd,DdNode *bNode,int iCof,int iLevel,int nLevels)

{
  uint i;
  int iVar1;
  DdNode *local_40;
  DdNode *bNode1;
  DdNode *bNode0;
  int nLevels_local;
  int iLevel_local;
  int iCof_local;
  DdNode *bNode_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)bNode;
  if ((*(int *)((ulong)bNode & 0xfffffffffffffffe) != 0x7fffffff) && (iLevel != nLevels)) {
    i = Cudd_NodeReadIndex(bNode);
    iVar1 = Cudd_ReadPerm(dd,i);
    local_40 = bNode;
    bNode1 = bNode;
    if (iVar1 <= iLevel) {
      if (((ulong)bNode & 1) == 0) {
        bNode1 = (bNode->type).kids.E;
        local_40 = (bNode->type).kids.T;
      }
      else {
        bNode1 = (DdNode *)(*(ulong *)(((ulong)bNode & 0xfffffffffffffffe) + 0x18) ^ 1);
        local_40 = (DdNode *)(*(ulong *)(((ulong)bNode & 0xfffffffffffffffe) + 0x10) ^ 1);
      }
    }
    if ((iCof >> (((char)nLevels + -1) - (char)iLevel & 0x1fU) & 1U) == 0) {
      dd_local = (DdManager *)Abc_NtkBddCofactors_rec(dd,bNode1,iCof,iLevel + 1,nLevels);
    }
    else {
      dd_local = (DdManager *)Abc_NtkBddCofactors_rec(dd,local_40,iCof,iLevel + 1,nLevels);
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Abc_NtkBddCofactors_rec( DdManager * dd, DdNode * bNode, int iCof, int iLevel, int nLevels )
{
    DdNode * bNode0, * bNode1;
    if ( Cudd_IsConstant(bNode) || iLevel == nLevels )
        return bNode;
    if ( Cudd_ReadPerm( dd, Cudd_NodeReadIndex(bNode) ) > iLevel )
    {
        bNode0 = bNode;
        bNode1 = bNode;
    }
    else if ( Cudd_IsComplement(bNode) )
    {
        bNode0 = Cudd_Not(cuddE(Cudd_Regular(bNode)));
        bNode1 = Cudd_Not(cuddT(Cudd_Regular(bNode)));
    }
    else
    {
        bNode0 = cuddE(bNode);
        bNode1 = cuddT(bNode);
    }
    if ( (iCof >> (nLevels-1-iLevel)) & 1 )
        return Abc_NtkBddCofactors_rec( dd, bNode1, iCof, iLevel + 1, nLevels );
    return Abc_NtkBddCofactors_rec( dd, bNode0, iCof, iLevel + 1, nLevels );
}